

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int imagetopgx(opj_image_t *image,char *outfile)

{
  uint uVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 local_194;
  undefined1 local_190;
  undefined1 local_189;
  int local_188;
  int iStack_184;
  uchar byte;
  int v;
  int val;
  uchar *line_buffer;
  size_t total;
  size_t dotpos;
  size_t olen;
  size_t res;
  char **ppcStack_150;
  int nbytes;
  char *name;
  char bname [256];
  opj_image_comp_t *comp;
  FILE *fdest;
  uint compno;
  int fails;
  int j;
  int i;
  int h;
  int w;
  char *outfile_local;
  opj_image_t *image_local;
  
  fdest._4_4_ = 1;
  fdest._0_4_ = 0;
  do {
    comp = (opj_image_comp_t *)0x0;
    if (image->numcomps <= (uint)fdest) {
      fdest._4_4_ = 0;
LAB_0010aea6:
      if (comp != (opj_image_comp_t *)0x0) {
        fclose((FILE *)comp);
      }
      return fdest._4_4_;
    }
    poVar3 = image->comps;
    ppcStack_150 = &name;
    res._4_4_ = 0;
    dotpos = strlen(outfile);
    total = dotpos - 4;
    line_buffer = (uchar *)(dotpos + 2);
    if (outfile[total] != '.') {
      fprintf(_stderr,"ERROR -> Impossible happen.");
      goto LAB_0010aea6;
    }
    if (((uchar *)0x100 < line_buffer) &&
       (ppcStack_150 = (char **)malloc(dotpos + 3), ppcStack_150 == (char **)0x0)) {
      fprintf(_stderr,"imagetopgx: memory out\n");
      goto LAB_0010aea6;
    }
    strncpy((char *)ppcStack_150,outfile,total);
    sprintf((char *)((long)ppcStack_150 + total),"_%u.pgx",(ulong)(uint)fdest);
    comp = (opj_image_comp_t *)fopen((char *)ppcStack_150,"wb");
    if ((FILE *)comp == (FILE *)0x0) {
      fprintf(_stderr,"ERROR -> failed to open %s for writing\n",ppcStack_150);
      if ((uchar *)0x100 < line_buffer) {
        free(ppcStack_150);
      }
      goto LAB_0010aea6;
    }
    uVar1 = image->comps[(uint)fdest].w;
    uVar2 = image->comps[(uint)fdest].h;
    uVar5 = 0x2b;
    if (poVar3[(uint)fdest].sgnd != 0) {
      uVar5 = 0x2d;
    }
    fprintf((FILE *)comp,"PG ML %c %d %d %d\n",uVar5,(ulong)poVar3[(uint)fdest].prec,(ulong)uVar1,
            (ulong)uVar2);
    if (poVar3[(uint)fdest].prec < 9) {
      res._4_4_ = 1;
    }
    else if (poVar3[(uint)fdest].prec < 0x11) {
      res._4_4_ = 2;
    }
    else {
      res._4_4_ = 4;
    }
    if (res._4_4_ == 1) {
      _v = malloc((long)(int)uVar1);
      if (_v == (void *)0x0) {
        fprintf(_stderr,"Out of memory");
        if ((uchar *)0x100 < line_buffer) {
          free(ppcStack_150);
        }
        goto LAB_0010aea6;
      }
      for (compno = 0; (int)compno < (int)uVar2; compno = compno + 1) {
        if ((poVar3[(uint)fdest].prec == 8) && (poVar3[(uint)fdest].sgnd == 0)) {
          for (fails = 0; fails < (int)uVar1; fails = fails + 1) {
            if (image->comps[(uint)fdest].data[(int)(compno * uVar1 + fails)] < 0) {
              local_190 = 0;
            }
            else {
              if (image->comps[(uint)fdest].data[(int)(compno * uVar1 + fails)] < 0x100) {
                local_194 = (undefined1)
                            image->comps[(uint)fdest].data[(int)(compno * uVar1 + fails)];
              }
              else {
                local_194 = 0xff;
              }
              local_190 = local_194;
            }
            *(undefined1 *)((long)_v + (long)fails) = local_190;
          }
        }
        else {
          for (fails = 0; fails < (int)uVar1; fails = fails + 1) {
            iVar4 = clamp(image->comps[(uint)fdest].data[(int)(compno * uVar1 + fails)],
                          poVar3[(uint)fdest].prec,poVar3[(uint)fdest].sgnd);
            *(char *)((long)_v + (long)fails) = (char)iVar4;
          }
        }
        olen = fwrite(_v,1,(long)(int)uVar1,(FILE *)comp);
        if (olen != (long)(int)uVar1) {
          fprintf(_stderr,"failed to write %d bytes for %s\n",(ulong)uVar1,ppcStack_150);
          if ((uchar *)0x100 < line_buffer) {
            free(ppcStack_150);
          }
          free(_v);
          goto LAB_0010aea6;
        }
      }
      free(_v);
    }
    else {
      for (fails = 0; fails < (int)(uVar1 * uVar2); fails = fails + 1) {
        iStack_184 = clamp(image->comps[(uint)fdest].data[fails],poVar3[(uint)fdest].prec,
                           poVar3[(uint)fdest].sgnd);
        compno = res._4_4_;
        while (compno = compno - 1, -1 < (int)compno) {
          local_188 = iStack_184 >> ((char)compno * '\b' & 0x1fU);
          local_189 = (undefined1)local_188;
          olen = fwrite(&local_189,1,1,(FILE *)comp);
          if (olen == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",ppcStack_150);
            if ((uchar *)0x100 < line_buffer) {
              free(ppcStack_150);
            }
            goto LAB_0010aea6;
          }
        }
      }
    }
    if ((uchar *)0x100 < line_buffer) {
      free(ppcStack_150);
    }
    fclose((FILE *)comp);
    fdest._0_4_ = (uint)fdest + 1;
  } while( true );
}

Assistant:

int imagetopgx(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, j, fails = 1;
    unsigned int compno;
    FILE *fdest = NULL;

    for (compno = 0; compno < image->numcomps; compno++) {
        opj_image_comp_t *comp = &image->comps[compno];
        char bname[256]; /* buffer for name */
        char *name = bname; /* pointer */
        int nbytes = 0;
        size_t res;
        const size_t olen = strlen(outfile);
        const size_t dotpos = olen - 4;
        const size_t total = dotpos + 1 + 1 + 4; /* '-' + '[1-3]' + '.pgx' */

        if (outfile[dotpos] != '.') {
            /* `pgx` was recognized but there is no dot at expected position */
            fprintf(stderr, "ERROR -> Impossible happen.");
            goto fin;
        }
        if (total > 256) {
            name = (char*)malloc(total + 1);
            if (name == NULL) {
                fprintf(stderr, "imagetopgx: memory out\n");
                goto fin;
            }
        }
        strncpy(name, outfile, dotpos);
        sprintf(name + dotpos, "_%u.pgx", compno);
        fdest = fopen(name, "wb");
        /* don't need name anymore */

        if (!fdest) {

            fprintf(stderr, "ERROR -> failed to open %s for writing\n", name);
            if (total > 256) {
                free(name);
            }
            goto fin;
        }

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        fprintf(fdest, "PG ML %c %d %d %d\n", comp->sgnd ? '-' : '+', comp->prec,
                w, h);

        if (comp->prec <= 8) {
            nbytes = 1;
        } else if (comp->prec <= 16) {
            nbytes = 2;
        } else {
            nbytes = 4;
        }

        if (nbytes == 1) {
            unsigned char* line_buffer = malloc((size_t)w);
            if (line_buffer == NULL) {
                fprintf(stderr, "Out of memory");
                if (total > 256) {
                    free(name);
                }
                goto fin;
            }
            for (j = 0; j < h; j++) {
                if (comp->prec == 8 && comp->sgnd == 0) {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)CLAMP(image->comps[compno].data[j * w + i], 0,
                                                              255);
                    }
                } else {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)
                                         clamp(image->comps[compno].data[j * w + i],
                                               (int)comp->prec, (int)comp->sgnd);
                    }
                }
                res = fwrite(line_buffer, 1, (size_t)w, fdest);
                if (res != (size_t)w) {
                    fprintf(stderr, "failed to write %d bytes for %s\n", w, name);
                    if (total > 256) {
                        free(name);
                    }
                    free(line_buffer);
                    goto fin;
                }
            }
            free(line_buffer);
        } else {

            for (i = 0; i < w * h; i++) {
                /* FIXME: clamp func is being called within a loop */
                const int val = clamp(image->comps[compno].data[i],
                                      (int)comp->prec, (int)comp->sgnd);

                for (j = nbytes - 1; j >= 0; j--) {
                    int v = (int)(val >> (j * 8));
                    unsigned char byte = (unsigned char)v;
                    res = fwrite(&byte, 1, 1, fdest);

                    if (res < 1) {
                        fprintf(stderr, "failed to write 1 byte for %s\n", name);
                        if (total > 256) {
                            free(name);
                        }
                        goto fin;
                    }
                }
            }
        }

        if (total > 256) {
            free(name);
        }
        fclose(fdest);
        fdest = NULL;
    }
    fails = 0;
fin:
    if (fdest) {
        fclose(fdest);
    }

    return fails;
}